

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.c
# Opt level: O0

int property_list(char *path)

{
  ssize_t sVar1;
  char *in_RDI;
  char recvBuf [1];
  char sendBuf [1];
  char local_12 [2];
  char *local_10;
  int local_4;
  
  local_10 = in_RDI;
  pthread_once(&gInitOnce,init);
  if (gPropFd < 0) {
    local_4 = -1;
  }
  else {
    memset(local_12 + 1,0xdd,1);
    local_12[1] = 3;
    pthread_mutex_lock((pthread_mutex_t *)&gPropertyFdLock);
    sVar1 = write(gPropFd,local_12 + 1,1);
    if (sVar1 == 1) {
      sVar1 = read(gPropFd,local_12,1);
      if (sVar1 == 1) {
        pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
        sprintf(local_10,"%s","/tmp/linux-sysprop-list");
        if (local_12[0] == '\x01') {
          local_4 = 0;
        }
        else {
          local_4 = -1;
        }
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
        local_4 = -1;
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int property_list(char *path)
{
    char sendBuf[1];
    char recvBuf[1];
	

    //LOGV("PROPERTY LIST\n");
    pthread_once(&gInitOnce, init);
    if (gPropFd < 0)
        return -1;

    memset(sendBuf, 0xdd, sizeof(sendBuf));    // placate valgrind

    sendBuf[0] = (char) kSystemPropertyList;

    pthread_mutex_lock(&gPropertyFdLock);
    if (write(gPropFd, sendBuf, sizeof(sendBuf)) != sizeof(sendBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    if (read(gPropFd, recvBuf, sizeof(recvBuf)) != sizeof(recvBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    pthread_mutex_unlock(&gPropertyFdLock);

	sprintf(path, "%s", SYSTEM_PROPERTY_LIST_NAME);

    if (recvBuf[0] != 1)
        return -1;
    return 0;
}